

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priolist.c
# Opt level: O1

void nn_priolist_activate(nn_priolist *self,nn_priolist_data *data)

{
  int iVar1;
  int iVar2;
  nn_list_item *it;
  nn_list *self_00;
  
  iVar1 = data->priority;
  self_00 = &self->slots[(long)iVar1 + -1].pipes;
  iVar2 = nn_list_empty(self_00);
  it = nn_list_end(self_00);
  nn_list_insert(self_00,&data->item,it);
  if (iVar2 != 0) {
    self->slots[(long)iVar1 + -1].current = data;
    if (data->priority < self->current || self->current == -1) {
      self->current = data->priority;
    }
  }
  return;
}

Assistant:

void nn_priolist_activate (struct nn_priolist *self,
    struct nn_priolist_data *data)
{
    struct nn_priolist_slot *slot;

    slot = &self->slots [data->priority - 1];

    /*  If there are already some elements in this slot, current pipe is not
        going to change. */
    if (!nn_list_empty (&slot->pipes)) {
        nn_list_insert (&slot->pipes, &data->item, nn_list_end (&slot->pipes));
        return;
    }

    /*  Add first pipe into the slot. If there are no pipes in priolist at all
        this slot becomes current. */
    nn_list_insert (&slot->pipes, &data->item, nn_list_end (&slot->pipes));
    slot->current = data;
    if (self->current == -1) {
        self->current = data->priority;
        return;
    }

    /*  If the current priority is lower than the one of the newly activated
        pipe, this slot becomes current. */
    if (self->current > data->priority) {
        self->current = data->priority;
        return;
    }

    /*  Current doesn't change otherwise. */
}